

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char16_t *b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  qsizetype qVar4;
  short sVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (a == b) {
    iVar2 = (uint)(blen < alen) * 2 + -1;
    if (alen == blen) {
      iVar2 = 0;
    }
    return iVar2;
  }
  qVar4 = blen;
  if (alen < blen) {
    qVar4 = alen;
  }
  if (qVar4 < 1) {
    qVar4 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar10 = (uint)(ushort)a[lVar7];
      iVar2 = uVar9 * 0x400 + -0x35fdc00;
      if ((uVar9 & 0xfc00) != 0xd800 || (uVar10 & 0xfc00) != 0xdc00) {
        iVar2 = 0;
      }
      uVar3 = iVar2 + uVar10;
      uVar9 = 0xff;
      if (uVar3 < 0x11000) {
        uVar9 = 0x1f;
      }
      uVar6 = uVar3 >> 5;
      if (0x10fff < uVar3) {
        uVar6 = (uVar3 - 0x11000 >> 8) + 0x880;
      }
      sVar5 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)((uVar9 & uVar10) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)uVar6 * 2)) * 2) * 0x14 + 0xe)
                     >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar9 & uVar10) +
                           (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar6 * 2)) *
                    2) * 0x14 + 0xe) & 1) == 0) {
        uVar3 = uVar3 + (int)sVar5;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2) == 1) {
        uVar3 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2 + 2);
      }
      uVar6 = (uint)(ushort)b[lVar7];
      iVar2 = uVar8 * 0x400 + -0x35fdc00;
      if ((uVar8 & 0xfc00) != 0xd800 || (uVar6 & 0xfc00) != 0xdc00) {
        iVar2 = 0;
      }
      uVar8 = iVar2 + (uint)(ushort)b[lVar7];
      uVar9 = 0xff;
      if (uVar8 < 0x11000) {
        uVar9 = 0x1f;
      }
      uVar1 = uVar8 >> 5;
      if (0x10fff < uVar8) {
        uVar1 = (uVar8 - 0x11000 >> 8) + 0x880;
      }
      sVar5 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)((uVar9 & uVar6) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)uVar1 * 2)) * 2) * 0x14 + 0xe)
                     >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar9 & uVar6) +
                           (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar1 * 2)) *
                    2) * 0x14 + 0xe) & 1) == 0) {
        uVar8 = uVar8 + (int)sVar5;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2) == 1) {
        uVar8 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2 + 2);
      }
      if (uVar3 - uVar8 != 0) {
        return uVar3 - uVar8;
      }
      lVar7 = lVar7 + 1;
      uVar9 = uVar10;
      uVar8 = uVar6;
    } while (qVar4 != lVar7);
  }
  iVar2 = 1;
  if (qVar4 == alen) {
    iVar2 = -(uint)(qVar4 != blen);
  }
  return iVar2;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char16_t *b)
{
    if (a == b)
        return qt_lencmp(alen, blen);

    char32_t alast = 0;
    char32_t blast = 0;
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
//         qDebug() << Qt::hex << alast << blast;
//         qDebug() << Qt::hex << "*a=" << *a << "alast=" << alast << "folded=" << foldCase (*a, alast);
//         qDebug() << Qt::hex << "*b=" << *b << "blast=" << blast << "folded=" << foldCase (*b, blast);
        int diff = foldCase(a[i], alast) - foldCase(b[i], blast);
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}